

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV1ObjectBlock(Parser *this,BaseNode *node)

{
  Type TVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  char *szName;
  long lVar5;
  string *out;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  
  iVar8 = 0;
LAB_003ffcb7:
  do {
    while( true ) {
      pbVar6 = (byte *)this->filePtr;
      bVar4 = *pbVar6;
      if (bVar4 < 0x7b) break;
      if (bVar4 == 0x7b) {
        iVar8 = iVar8 + 1;
      }
      else {
        if (bVar4 != 0x7d) goto LAB_003ffe07;
        iVar8 = iVar8 + -1;
        if (iVar8 == 0) {
          this->filePtr = (char *)(pbVar6 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      bVar2 = false;
LAB_003ffe2e:
      this->bLastWasEndLine = bVar2;
      this->filePtr = (char *)(pbVar6 + 1);
    }
    if (bVar4 != 0x2a) {
      if (bVar4 == 0) {
        return;
      }
LAB_003ffe07:
      bVar2 = false;
      if ((bVar4 < 0xe) && ((0x3401U >> (bVar4 & 0x1f) & 1) != 0)) {
        if (this->bLastWasEndLine == false) {
          this->iLineNumber = this->iLineNumber + 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      goto LAB_003ffe2e;
    }
    pbVar7 = pbVar6 + 1;
    this->filePtr = (char *)pbVar7;
    iVar3 = strncmp("NODE_NAME",(char *)pbVar7,9);
    if (iVar3 == 0) {
      bVar4 = pbVar6[10];
      if ((0x20 < (ulong)bVar4) || ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) == 0))
      goto LAB_003ffd13;
      if (bVar4 == 0) {
        pbVar6 = pbVar6 + 10;
      }
      else {
        pbVar6 = pbVar6 + 0xb;
      }
      this->filePtr = (char *)pbVar6;
      szName = "*NODE_NAME";
      out = &node->mName;
LAB_003fff3a:
      bVar2 = ParseString(this,out,szName);
      if (!bVar2) {
        SkipToNextToken(this);
      }
      goto LAB_003ffcb7;
    }
LAB_003ffd13:
    iVar3 = strncmp("NODE_PARENT",(char *)pbVar7,0xb);
    if (iVar3 == 0) {
      bVar4 = pbVar6[0xc];
      if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
        if (bVar4 == 0) {
          pbVar6 = pbVar6 + 0xc;
        }
        else {
          pbVar6 = pbVar6 + 0xd;
        }
        this->filePtr = (char *)pbVar6;
        szName = "*NODE_PARENT";
        out = &node->mParent;
        goto LAB_003fff3a;
      }
    }
    iVar3 = strncmp("NODE_TM",(char *)pbVar7,7);
    if (iVar3 != 0) {
LAB_003ffd4b:
      iVar3 = strncmp("TM_ANIMATION",(char *)pbVar7,0xc);
      if (iVar3 == 0) {
        bVar4 = pbVar6[0xd];
        if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
          if (bVar4 == 0) {
            pbVar6 = pbVar6 + 0xd;
          }
          else {
            pbVar6 = pbVar6 + 0xe;
          }
          this->filePtr = (char *)pbVar6;
          ParseLV2AnimationBlock(this,node);
          goto LAB_003ffcb7;
        }
      }
      TVar1 = node->mType;
      if (TVar1 == Mesh) {
        iVar3 = strncmp("MESH",(char *)pbVar7,4);
        if (iVar3 == 0) {
          bVar4 = pbVar6[5];
          if ((0x20 < (ulong)bVar4) || ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) == 0))
          goto LAB_003fffec;
          pbVar7 = pbVar6 + 5;
          lVar5 = 6;
LAB_0040010c:
          if (bVar4 != 0) {
            pbVar7 = pbVar6 + lVar5;
          }
          this->filePtr = (char *)pbVar7;
          ParseLV2MeshBlock(this,(Mesh *)&node[-1].mTargetAnim.akeyRotations.
                                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                                          _M_impl.super__Vector_impl_data._M_finish);
          goto LAB_003ffcb7;
        }
LAB_003fffec:
        iVar3 = strncmp("MESH_SOFTSKIN",(char *)pbVar7,0xd);
        if (iVar3 == 0) {
          bVar4 = pbVar6[0xe];
          if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
            pbVar7 = pbVar6 + 0xe;
            lVar5 = 0xf;
            goto LAB_0040010c;
          }
        }
        iVar3 = strncmp("MATERIAL_REF",(char *)pbVar7,0xc);
        if (iVar3 == 0) {
          bVar4 = pbVar6[0xd];
          if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
            if (bVar4 == 0) {
              pbVar6 = pbVar6 + 0xd;
            }
            else {
              pbVar6 = pbVar6 + 0xe;
            }
            this->filePtr = (char *)pbVar6;
            ParseLV4MeshLong(this,(uint *)&node[1].mTargetAnim.akeyRotations);
            goto LAB_003ffcb7;
          }
        }
      }
      else if (TVar1 == Camera) {
        iVar3 = strncmp("CAMERA_SETTINGS",(char *)pbVar7,0xf);
        if (iVar3 == 0) {
          bVar4 = pbVar6[0x10];
          if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
            if (bVar4 == 0) {
              pbVar6 = pbVar6 + 0x10;
            }
            else {
              pbVar6 = pbVar6 + 0x11;
            }
            this->filePtr = (char *)pbVar6;
            ParseLV2CameraSettingsBlock(this,(Camera *)node);
            goto LAB_003ffcb7;
          }
        }
        iVar3 = strncmp("CAMERA_TYPE",(char *)pbVar7,0xb);
        if (iVar3 == 0) {
          bVar4 = pbVar6[0xc];
          if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
            if (bVar4 == 0) {
              pbVar6 = pbVar6 + 0xc;
            }
            else {
              pbVar6 = pbVar6 + 0xd;
            }
            this->filePtr = (char *)pbVar6;
            iVar3 = strncasecmp("target",(char *)pbVar6,6);
            if (iVar3 == 0) {
              *(undefined4 *)&node[1].mName._M_dataplus._M_p = 1;
            }
            else {
              iVar3 = strncasecmp("free",(char *)pbVar6,4);
              if (iVar3 == 0) {
                *(undefined4 *)&node[1].mName._M_dataplus._M_p = 0;
              }
              else {
                LogWarning(this,"Unknown kind of camera");
              }
            }
            goto LAB_003ffcb7;
          }
        }
      }
      else if (TVar1 == Light) {
        iVar3 = strncmp("LIGHT_SETTINGS",(char *)pbVar7,0xe);
        if (iVar3 == 0) {
          bVar4 = pbVar6[0xf];
          if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
            if (bVar4 == 0) {
              pbVar6 = pbVar6 + 0xf;
            }
            else {
              pbVar6 = pbVar6 + 0x10;
            }
            this->filePtr = (char *)pbVar6;
            ParseLV2LightSettingsBlock(this,(Light *)node);
            goto LAB_003ffcb7;
          }
        }
        iVar3 = strncmp("LIGHT_TYPE",(char *)pbVar7,10);
        if (iVar3 == 0) {
          bVar4 = pbVar6[0xb];
          if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
            if (bVar4 == 0) {
              pbVar6 = pbVar6 + 0xb;
            }
            else {
              pbVar6 = pbVar6 + 0xc;
            }
            this->filePtr = (char *)pbVar6;
            iVar3 = strncasecmp("omni",(char *)pbVar6,4);
            if (iVar3 == 0) {
              *(undefined4 *)&node->field_0x154 = 0;
            }
            else {
              iVar3 = strncasecmp("target",(char *)pbVar6,6);
              if (iVar3 == 0) {
                *(undefined4 *)&node->field_0x154 = 1;
              }
              else {
                iVar3 = strncasecmp("free",(char *)pbVar6,4);
                if (iVar3 == 0) {
                  *(undefined4 *)&node->field_0x154 = 2;
                }
                else {
                  iVar3 = ASSIMP_strincmp("directional",(char *)pbVar6,0xb);
                  if (iVar3 == 0) {
                    *(undefined4 *)&node->field_0x154 = 3;
                  }
                  else {
                    LogWarning(this,"Unknown kind of light source");
                  }
                }
              }
            }
            goto LAB_003ffcb7;
          }
        }
      }
      bVar4 = *pbVar7;
      pbVar6 = pbVar7;
      goto LAB_003ffe07;
    }
    bVar4 = pbVar6[8];
    if ((0x20 < (ulong)bVar4) || ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) == 0))
    goto LAB_003ffd4b;
    if (bVar4 == 0) {
      pbVar6 = pbVar6 + 8;
    }
    else {
      pbVar6 = pbVar6 + 9;
    }
    this->filePtr = (char *)pbVar6;
    ParseLV2NodeTransformBlock(this,node);
  } while( true );
}

Assistant:

void Parser::ParseLV1ObjectBlock(ASE::BaseNode& node)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // first process common tokens such as node name and transform
            // name of the mesh/node
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                if(!ParseString(node.mName,"*NODE_NAME"))
                    SkipToNextToken();
                continue;
            }
            // name of the parent of the node
            if (TokenMatch(filePtr,"NODE_PARENT" ,11) )
            {
                if(!ParseString(node.mParent,"*NODE_PARENT"))
                    SkipToNextToken();
                continue;
            }
            // transformation matrix of the node
            if (TokenMatch(filePtr,"NODE_TM" ,7))
            {
                ParseLV2NodeTransformBlock(node);
                continue;
            }
            // animation data of the node
            if (TokenMatch(filePtr,"TM_ANIMATION" ,12))
            {
                ParseLV2AnimationBlock(node);
                continue;
            }

            if (node.mType == BaseNode::Light)
            {
                // light settings
                if (TokenMatch(filePtr,"LIGHT_SETTINGS" ,14))
                {
                    ParseLV2LightSettingsBlock((ASE::Light&)node);
                    continue;
                }
                // type of the light source
                if (TokenMatch(filePtr,"LIGHT_TYPE" ,10))
                {
                    if (!ASSIMP_strincmp("omni",filePtr,4))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::OMNI;
                    }
                    else if (!ASSIMP_strincmp("target",filePtr,6))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::TARGET;
                    }
                    else if (!ASSIMP_strincmp("free",filePtr,4))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::FREE;
                    }
                    else if (!ASSIMP_strincmp("directional",filePtr,11))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::DIRECTIONAL;
                    }
                    else
                    {
                        LogWarning("Unknown kind of light source");
                    }
                    continue;
                }
            }
            else if (node.mType == BaseNode::Camera)
            {
                // Camera settings
                if (TokenMatch(filePtr,"CAMERA_SETTINGS" ,15))
                {
                    ParseLV2CameraSettingsBlock((ASE::Camera&)node);
                    continue;
                }
                else if (TokenMatch(filePtr,"CAMERA_TYPE" ,11))
                {
                    if (!ASSIMP_strincmp("target",filePtr,6))
                    {
                        ((ASE::Camera&)node).mCameraType = ASE::Camera::TARGET;
                    }
                    else if (!ASSIMP_strincmp("free",filePtr,4))
                    {
                        ((ASE::Camera&)node).mCameraType = ASE::Camera::FREE;
                    }
                    else
                    {
                        LogWarning("Unknown kind of camera");
                    }
                    continue;
                }
            }
            else if (node.mType == BaseNode::Mesh)
            {
                // mesh data
                // FIX: Older files use MESH_SOFTSKIN
                if (TokenMatch(filePtr,"MESH" ,4) ||
                    TokenMatch(filePtr,"MESH_SOFTSKIN",13))
                {
                    ParseLV2MeshBlock((ASE::Mesh&)node);
                    continue;
                }
                // mesh material index
                if (TokenMatch(filePtr,"MATERIAL_REF" ,12))
                {
                    ParseLV4MeshLong(((ASE::Mesh&)node).iMaterialIndex);
                    continue;
                }
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
    return;
}